

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O3

void __thiscall Pool::Dump(Pool *this)

{
  _Rb_tree_node_base *p_Var1;
  
  printf("%s (%d/%d) ->\n",(this->name_)._M_dataplus._M_p,(ulong)(uint)this->current_use_,
         (ulong)(uint)this->depth_);
  for (p_Var1 = (this->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->delayed_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    putchar(9);
    Edge::Dump(*(Edge **)(p_Var1 + 1),"");
  }
  return;
}

Assistant:

void Pool::Dump() const {
  printf("%s (%d/%d) ->\n", name_.c_str(), current_use_, depth_);
  for (DelayedEdges::const_iterator it = delayed_.begin();
       it != delayed_.end(); ++it)
  {
    printf("\t");
    (*it)->Dump();
  }
}